

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_test.cpp
# Opt level: O2

void __thiscall bidfx_public_api::price::SubscriptionTest::SubscriptionTest(SubscriptionTest *this)

{
  Subject *this_00;
  BasicUserInfo *pBVar1;
  string *psVar2;
  Tenor *pTVar3;
  undefined8 *puVar4;
  Subscription *pSVar5;
  allocator<char> local_204;
  allocator<char> local_203;
  allocator<char> local_202;
  allocator<char> local_201;
  SubjectFactory local_200 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  allocator<char> local_1c8 [32];
  allocator<char> local_1a8 [32];
  allocator<char> local_188 [32];
  allocator<char> local_168 [32];
  undefined8 local_148;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  allocator<char> local_a0 [32];
  string local_80 [32];
  allocator<char> local_60 [64];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SubscriptionTest_00277478;
  this_00 = &this->subject_;
  bidfx_public_api::price::subject::Subject::Subject(this_00);
  pBVar1 = (BasicUserInfo *)operator_new(0xf0);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"localhost",local_60);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"lasman",local_a0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"FX_ACCT",local_168);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"CPP",local_188);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"0",local_1a8);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"-",local_1c8);
  bidfx_public_api::BasicUserInfo::BasicUserInfo
            (pBVar1,local_c0,local_e0,local_100,local_120,local_140,local_80);
  this->user_info = (UserInfo *)pBVar1;
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_200,this->user_info);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_148 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"FX_ACCT",&local_201);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::BuySideAccount
                     ((string *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_188,"EUR",&local_202);
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"EURUSD",&local_203);
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity(1000.0);
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"DBFX",&local_204);
  puVar4 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider(psVar2);
  (**(code **)*puVar4)(&local_1e0,puVar4);
  bidfx_public_api::price::subject::Subject::operator=(this_00,(Subject *)&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_168);
  subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
            ((MandatoryFieldsSubjectCreator *)local_60);
  pSVar5 = (Subscription *)operator_new(0x50);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_1f8,this_00);
  bidfx_public_api::price::Subscription::Subscription(pSVar5,&local_1f8);
  this->subscription_ = pSVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

SubscriptionTest()
    {
        user_info = new BasicUserInfo("localhost", "lasman", "FX_ACCT", "CPP", "0", "-");
        subject_ = subject::SubjectFactory(user_info).Fx().Stream().Forward().BuySideAccount("FX_ACCT").Currency("EUR").CurrencyPair("EURUSD").Quantity(1000).Tenor(Tenor::IN_2_MONTHS).LiquidityProvider("DBFX").CreateSubject();
        subscription_ = new Subscription(subject_);
    }